

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

QSize __thiscall QHeaderView::sectionSizeFromContents(QHeaderView *this,int logicalIndex)

{
  long lVar1;
  PrivateShared *pPVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  bool bVar8;
  char cVar9;
  QSize QVar10;
  QStyle *pQVar11;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_158;
  PrivateShared *local_138;
  undefined1 *puStack_130;
  undefined1 local_120 [64];
  int local_e0;
  Data *local_d8;
  char16_t *pcStack_d0;
  qsizetype local_c8;
  QIcon local_b8 [2];
  SortIndicator local_a4;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  QWidget::ensurePolished((QWidget *)this);
  local_58._16_4_ = 0xaaaaaaaa;
  local_58._20_4_ = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58._0_4_ = 0xaaaaaaaa;
  local_58._4_4_ = 0xaaaaaaaa;
  local_58._8_4_ = 0xaaaaaaaa;
  local_58._12_4_ = 0xaaaaaaaa;
  (**(code **)(**(long **)(lVar1 + 0x2f8) + 0xa0))
            (&local_58,*(long **)(lVar1 + 0x2f8),logicalIndex,*(undefined4 *)(lVar1 + 0x548),0xd);
  if (3 < CONCAT44(uStack_3c,uStack_40)) {
    QVar10 = qvariant_cast<QSize>((QVariant *)&local_58);
    goto LAB_004fca47;
  }
  memset((QStyleOptionHeaderV2 *)local_120,0xaa,0x88);
  QStyleOptionHeaderV2::QStyleOptionHeaderV2((QStyleOptionHeaderV2 *)local_120);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x318))(this,(QStyleOptionHeaderV2 *)local_120);
  local_78._16_4_ = 0xaaaaaaaa;
  local_78._20_4_ = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  local_78._0_4_ = 0xaaaaaaaa;
  local_78._4_4_ = 0xaaaaaaaa;
  local_78._8_4_ = 0xaaaaaaaa;
  local_78._12_4_ = 0xaaaaaaaa;
  local_e0 = logicalIndex;
  (**(code **)(**(long **)(lVar1 + 0x2f8) + 0xa0))
            (&local_78,*(long **)(lVar1 + 0x2f8),logicalIndex,*(undefined4 *)(lVar1 + 0x548),6);
  local_138 = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)&local_138);
  if (CONCAT44(uStack_5c,uStack_60) < 4) {
LAB_004fc868:
    QFont::operator=((QFont *)&local_138,
                     &((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                       super_QWidget.data)->fnt);
  }
  else {
    bVar8 = ::QVariant::canConvert<QFont>((QVariant *)&local_78);
    if (!bVar8) goto LAB_004fc868;
    qvariant_cast<QFont>((QVariant *)&local_98);
    pPVar2 = local_138;
    local_138 = local_98.shared;
    local_98.shared = pPVar2;
    uVar3 = puStack_130._0_4_;
    puStack_130 = (undefined1 *)CONCAT44(puStack_130._4_4_,local_98._8_4_);
    local_98._8_4_ = uVar3;
    QFont::~QFont((QFont *)local_98.data);
  }
  QFont::setWeight((Weight)(QFont *)&local_138);
  QFontMetrics::QFontMetrics((QFontMetrics *)local_98.data,(QFont *)&local_138);
  uVar4 = local_120._32_8_;
  local_120._32_8_ = local_98.shared;
  local_98.shared = (PrivateShared *)uVar4;
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_98.data);
  (**(code **)(**(long **)(lVar1 + 0x2f8) + 0xa0))
            (&local_98,*(long **)(lVar1 + 0x2f8),logicalIndex,*(undefined4 *)(lVar1 + 0x548),0);
  ::QVariant::toString();
  qVar7 = local_c8;
  pcVar6 = pcStack_d0;
  pDVar5 = local_d8;
  local_d8 = local_158.d;
  pcStack_d0 = local_158.ptr;
  local_158.d = pDVar5;
  local_158.ptr = pcVar6;
  local_c8 = local_158.size;
  local_158.size = qVar7;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
  ::QVariant::~QVariant((QVariant *)&local_98);
  (**(code **)(**(long **)(lVar1 + 0x2f8) + 0xa0))
            (&local_98,*(long **)(lVar1 + 0x2f8),logicalIndex,*(undefined4 *)(lVar1 + 0x548),1);
  ::QVariant::operator=((QVariant *)&local_58,(QVariant *)&local_98);
  ::QVariant::~QVariant((QVariant *)&local_98);
  qvariant_cast<QIcon>((QVariant *)&local_98);
  QIcon::operator=(local_b8,(QIcon *)&local_98.shared);
  QIcon::~QIcon((QIcon *)&local_98.shared);
  cVar9 = QIcon::isNull();
  if (cVar9 != '\0') {
    qvariant_cast<QPixmap>((QVariant *)&local_98);
    QIcon::QIcon((QIcon *)&local_158,(QPixmap *)local_98.data);
    QIcon::operator=(local_b8,(QIcon *)&local_158);
    QIcon::~QIcon((QIcon *)&local_158);
    QPixmap::~QPixmap((QPixmap *)local_98.data);
  }
  if (*(char *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                          super_QWidget.field_0x8 + 0x554) == '\x01') {
    local_a4 = SortDown;
  }
  pQVar11 = QWidget::style((QWidget *)this);
  local_98._forAlignment = -NAN;
  QVar10 = (QSize)(**(code **)(*(long *)pQVar11 + 0xe8))
                            (pQVar11,0x13,(QStyleOptionHeader *)local_120,&local_98,this);
  QFont::~QFont((QFont *)&local_138);
  ::QVariant::~QVariant((QVariant *)&local_78);
  QStyleOptionHeader::~QStyleOptionHeader((QStyleOptionHeader *)local_120);
LAB_004fca47:
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QHeaderView::sectionSizeFromContents(int logicalIndex) const
{
    Q_D(const QHeaderView);
    Q_ASSERT(logicalIndex >= 0);

    ensurePolished();

    // use SizeHintRole
    QVariant variant = d->model->headerData(logicalIndex, d->orientation, Qt::SizeHintRole);
    if (variant.isValid())
        return qvariant_cast<QSize>(variant);

    // otherwise use the contents
    QStyleOptionHeaderV2 opt;
    initStyleOption(&opt);
    opt.section = logicalIndex;
    QVariant var = d->model->headerData(logicalIndex, d->orientation,
                                            Qt::FontRole);
    QFont fnt;
    if (var.isValid() && var.canConvert<QFont>())
        fnt = qvariant_cast<QFont>(var);
    else
        fnt = font();
    fnt.setBold(true);
    opt.fontMetrics = QFontMetrics(fnt);
    opt.text = d->model->headerData(logicalIndex, d->orientation,
                                    Qt::DisplayRole).toString();
    variant = d->model->headerData(logicalIndex, d->orientation, Qt::DecorationRole);
    opt.icon = qvariant_cast<QIcon>(variant);
    if (opt.icon.isNull())
        opt.icon = qvariant_cast<QPixmap>(variant);
    if (isSortIndicatorShown())
        opt.sortIndicator = QStyleOptionHeader::SortDown;
    return style()->sizeFromContents(QStyle::CT_HeaderSection, &opt, QSize(), this);
}